

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FM.cpp
# Opt level: O0

const_iterator __thiscall GainBuckets::addCell(GainBuckets *this,int gain,uint cell)

{
  Bucket *pBVar1;
  const_iterator cVar2;
  uint local_20;
  int local_1c;
  uint cell_local;
  int gain_local;
  GainBuckets *this_local;
  
  this->num_elems_ = this->num_elems_ + 1;
  if (this->best_gain_ < gain) {
    this->best_gain_ = gain;
  }
  local_20 = cell;
  local_1c = gain;
  _cell_local = this;
  pBVar1 = operator[][abi_cxx11_(this,gain);
  std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::push_front(pBVar1,&local_20);
  pBVar1 = operator[][abi_cxx11_(this,local_1c);
  cVar2 = std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::cbegin(pBVar1);
  return (const_iterator)cVar2._M_node;
}

Assistant:

GainBuckets::Bucket::const_iterator GainBuckets::addCell(int gain, unsigned cell) {
  ++num_elems_;
  if (gain > best_gain_)
    best_gain_ = gain;
  (*this)[gain].push_front(cell);
  return (*this)[gain].cbegin();
}